

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O0

vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
* __thiscall
pfederc::Parser::parseFuncParameters
          (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  type pEVar4;
  tuple<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  tVar5;
  undefined1 local_d0 [24];
  unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  *local_b8;
  __normal_iterator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_*,_std::vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>_>
  local_b0;
  const_iterator local_a8;
  undefined1 local_a0 [8];
  unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  funcparam;
  __normal_iterator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_*,_std::vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>_>
  local_88;
  const_iterator local_80;
  int local_74;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  funcparam_1;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  parameters;
  undefined1 local_30 [7];
  bool err;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_28;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  sanityExpect(this,TOK_OP_BRACKET_OPEN);
  pTVar3 = Lexer::getCurrentToken(this->lexer);
  bVar1 = Token::operator==(pTVar3,TOK_BRACKET_CLOSE);
  if (bVar1) {
    stack0xffffffffffffffd6 = 2;
    local_30._0_4_ = 5;
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    Token::getPosition(pTVar3);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_28,(SyntaxErrorCode *)(local_30 + 6),(Position *)local_30);
    generateError((Parser *)&stack0xffffffffffffffe0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffe0);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_28);
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    bVar1 = false;
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::vector((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
              *)&expr);
    parseExpression((Parser *)&biopexpr,(Precedence)this);
    do {
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &biopexpr);
      bVar2 = isBiOpExpr(pEVar4,TOK_OP_COMMA);
      if (!bVar2) break;
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &biopexpr);
      tVar5.
      super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      .
      super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
            )__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
      if (tVar5.
          super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          .
          super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
          ._M_head_impl ==
          (_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
           )0x0) {
        __cxa_bad_cast();
      }
      funcparam_1._M_t.
      super___uniq_ptr_impl<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      .
      super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
              )tVar5.
               super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
               .
               super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
               ._M_head_impl;
      BiOpExpr::getRightPtr((BiOpExpr *)local_70);
      fromExprToFunctionParam
                ((Parser *)local_68,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_70);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_68);
      if (bVar2) {
        local_88._M_current =
             (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              *)std::
                vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                ::begin((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                         *)&expr);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>const*,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>>
        ::
        __normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>*>
                  ((__normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>const*,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>>
                    *)&local_80,&local_88);
        std::
        vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
        ::insert((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                  *)&expr,local_80,(value_type *)local_68);
        BiOpExpr::getLeftPtr((BiOpExpr *)&funcparam);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&funcparam);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&funcparam);
        local_74 = 0;
      }
      else {
        bVar1 = true;
        local_74 = 3;
      }
      std::
      unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                     *)local_68);
    } while (local_74 == 0);
    fromExprToFunctionParam
              ((Parser *)local_a0,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_a0);
    if (bVar2) {
      local_b0._M_current =
           (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
            *)std::
              vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
              ::begin((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                       *)&expr);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>const*,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>>
      ::
      __normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>*>
                ((__normal_iterator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>const*,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>>
                  *)&local_a8,&local_b0);
      local_b8 = (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                  *)std::
                    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                    ::insert((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                              *)&expr,local_a8,(value_type *)local_a0);
    }
    else {
      bVar1 = true;
    }
    bVar2 = expect(this,TOK_BRACKET_CLOSE);
    if (!bVar2) {
      bVar1 = true;
      local_d0._6_2_ = 2;
      local_d0._0_4_ = 1;
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_d0 + 8),(SyntaxErrorCode *)(local_d0 + 6),(Position *)local_d0);
      generateError((Parser *)(local_d0 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_d0 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_d0 + 8));
    }
    if (bVar1) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      ::vector(__return_storage_ptr__);
    }
    else {
      std::
      vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      ::vector(__return_storage_ptr__,
               (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                *)&expr);
    }
    local_74 = 1;
    std::
    unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                   *)local_a0);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&biopexpr);
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::~vector((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
               *)&expr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<FuncParameter>> Parser::parseFuncParameters() noexcept {
  sanityExpect(TokenType::TOK_OP_BRACKET_OPEN);

  if (*lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_PARAMETERS, lexer.getCurrentToken()->getPosition()));
    return std::vector<std::unique_ptr<FuncParameter>>();
  }

  bool err = false;
  std::vector<std::unique_ptr<FuncParameter>> parameters;

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto funcparam = fromExprToFunctionParam(biopexpr.getRightPtr());
    if (!funcparam) {
      err = true;
      break;
    }

    parameters.insert(parameters.begin(), std::move(funcparam));
    // reduce
    expr = biopexpr.getLeftPtr();
  }

  auto funcparam = fromExprToFunctionParam(std::move(expr));
  if (!funcparam)
    err = true;
  else
    parameters.insert(parameters.begin(), std::move(funcparam));

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    err = true;
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return std::vector<std::unique_ptr<FuncParameter>>();

  return parameters;
}